

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O3

void __thiscall
QAbstractFileEngineHandlerList::~QAbstractFileEngineHandlerList
          (QAbstractFileEngineHandlerList *this)

{
  Data *pDVar1;
  
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
  operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
              *)this);
  qt_abstractfileenginehandlerlist_shutDown = 1;
  pDVar1 = (this->super_QList<QAbstractFileEngineHandler_*>).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate
                (&((this->super_QList<QAbstractFileEngineHandler_*>).d.d)->super_QArrayData,8,0x10);
      return;
    }
  }
  return;
}

Assistant:

~QAbstractFileEngineHandlerList()
    {
        QWriteLocker locker(fileEngineHandlerMutex());
        qt_abstractfileenginehandlerlist_shutDown = true;
    }